

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::PrimitiveFieldGenerator::SetExtraRuntimeHasBitsBase
          (PrimitiveFieldGenerator *this,int has_base)

{
  ObjectiveCType OVar1;
  mapped_type *pmVar2;
  AlphaNum *in_RDI;
  undefined8 in_stack_fffffffffffffef8;
  int i32;
  AlphaNum *in_stack_ffffffffffffff00;
  string *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff40;
  string local_b8 [55];
  allocator local_81;
  string local_80 [80];
  string local_30 [48];
  
  i32 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  OVar1 = GetObjectiveCType((FieldDescriptor *)0x5b07fc);
  if (OVar1 == OBJECTIVECTYPE_BOOLEAN) {
    strings::AlphaNum::AlphaNum(in_stack_ffffffffffffff00,i32);
    StrCat_abi_cxx11_(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"storage_offset_value",&local_81);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](in_stack_ffffffffffffff40,(key_type *)in_RDI);
    this_00 = local_30;
    std::__cxx11::string::operator=((string *)pmVar2,this_00);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::__cxx11::string::~string(this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b8,"storage_offset_comment",(allocator *)&stack0xffffffffffffff47);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](in_stack_ffffffffffffff40,(key_type *)in_RDI);
    std::__cxx11::string::operator=((string *)pmVar2,"  // Stored in _has_storage_ to save space.");
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
  }
  return;
}

Assistant:

void PrimitiveFieldGenerator::SetExtraRuntimeHasBitsBase(int has_base) {
  if (GetObjectiveCType(descriptor_) == OBJECTIVECTYPE_BOOLEAN) {
    // Set into the offset the has bit to use for the actual value.
    variables_["storage_offset_value"] = StrCat(has_base);
    variables_["storage_offset_comment"] =
        "  // Stored in _has_storage_ to save space.";
  }
}